

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<short,_unsigned_long_long,_3>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short *t,uint64_t *u,short *result)

{
  ulong uVar1;
  short sVar2;
  char cVar3;
  
  uVar1 = *u;
  if (uVar1 != 0) {
    sVar2 = *t;
    if (sVar2 == 0) {
      sVar2 = 0;
    }
    else if (uVar1 < 0x8000) {
      cVar3 = (char)(sVar2 >> 0xf);
      sVar2 = (short)(CONCAT22(CONCAT11(cVar3,cVar3),sVar2) / (int)(short)uVar1);
    }
    else {
      sVar2 = 0;
    }
    *result = sVar2;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const std::uint64_t& u, T& result ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");

        if( u == 0 )
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u <= (std::uint64_t)std::numeric_limits<T>::max() )
        {
            result = div_signed_uint64 < T, U, sizeof(T) < sizeof(std::int64_t) > ::divide(t, u);
        }
        else // Corner case
        if( t == std::numeric_limits<T>::min() && u == (std::uint64_t)std::numeric_limits<T>::min() )
        {
            // Min int divided by it's own magnitude is -1
            result = -1;
        }
        else
        {
            result = 0;
        }
    }